

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# higher_order_functions.c
# Opt level: O0

int fun_zip_add_min_default(int *e1,int *e2,int count)

{
  int local_2c;
  int local_24;
  int en;
  int decomp;
  int i;
  int count_local;
  int *e2_local;
  int *e1_local;
  
  local_24 = 10000000;
  for (en = 0; en < count; en = en + 1) {
    if ((e1[en] != 10000000) && (e2[en] != 10000000)) {
      local_2c = e1[en] + e2[en];
      if (local_24 < local_2c) {
        local_2c = local_24;
      }
      local_24 = local_2c;
    }
  }
  return local_24;
}

Assistant:

static int
fun_zip_add_min_default(const int *e1,
                        const int *e2,
                        int       count)
{
  int i;
  int decomp = INF;

  for (i = 0; i < count; i++) {
    if ((e1[i] != INF) && (e2[i] != INF)) {
      const int en = e1[i] + e2[i];
      decomp = MIN2(decomp, en);
    }
  }

  return decomp;
}